

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O3

int InitPassStats(VP8Encoder *enc,PassStats *s)

{
  float fVar1;
  undefined8 uVar2;
  int iVar3;
  double dVar4;
  float fVar5;
  float fVar7;
  undefined1 auVar6 [16];
  float fVar8;
  
  iVar3 = (enc->filter_hdr_).simple_;
  fVar1 = (float)(enc->filter_hdr_).level_;
  s->is_first = 1;
  s->dq = 10.0;
  uVar2 = *(undefined8 *)&(enc->bw_).field_0x2c;
  fVar5 = (float)(int)uVar2;
  fVar7 = (float)(int)((ulong)uVar2 >> 0x20);
  s->qmin = fVar5;
  s->qmax = fVar7;
  fVar8 = *(float *)((long)&enc->config_ + 4);
  if (fVar8 <= fVar7) {
    fVar7 = fVar8;
  }
  fVar8 = (float)(-(uint)(fVar8 < fVar5) & (uint)fVar5 | ~-(uint)(fVar8 < fVar5) & (uint)fVar7);
  s->last_q = fVar8;
  s->q = fVar8;
  if ((long)iVar3 == 0) {
    if (0.0 < fVar1) {
      dVar4 = (double)fVar1;
    }
    else {
      dVar4 = 40.0;
    }
  }
  else {
    auVar6._8_4_ = iVar3 >> 0x1f;
    auVar6._0_8_ = (long)iVar3;
    auVar6._12_4_ = 0x45300000;
    dVar4 = (auVar6._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0);
  }
  s->target = dVar4;
  s->value = 0.0;
  s->last_value = 0.0;
  s->do_size_search = (uint)(iVar3 != 0);
  return iVar3;
}

Assistant:

static int InitPassStats(const VP8Encoder* const enc, PassStats* const s) {
  const uint64_t target_size = (uint64_t)enc->config_->target_size;
  const int do_size_search = (target_size != 0);
  const float target_PSNR = enc->config_->target_PSNR;

  s->is_first = 1;
  s->dq = 10.f;
  s->qmin = 1.f * enc->config_->qmin;
  s->qmax = 1.f * enc->config_->qmax;
  s->q = s->last_q = Clamp(enc->config_->quality, s->qmin, s->qmax);
  s->target = do_size_search ? (double)target_size
            : (target_PSNR > 0.) ? target_PSNR
            : 40.;   // default, just in case
  s->value = s->last_value = 0.;
  s->do_size_search = do_size_search;
  return do_size_search;
}